

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexHull.cpp
# Opt level: O1

void __thiscall ConvexH::ConvexH(ConvexH *this,int vertices_size,int edges_size,int facets_size)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  cbtVector3 *ptr;
  HalfEdge *ptr_00;
  cbtPlane *pcVar4;
  undefined8 uVar5;
  cbtVector3 *pcVar6;
  long lVar7;
  HalfEdge *pHVar8;
  cbtPlane *pcVar9;
  long lVar10;
  cbtScalar *pcVar11;
  
  (this->vertices).m_ownsMemory = true;
  (this->vertices).m_data = (cbtVector3 *)0x0;
  (this->vertices).m_size = 0;
  (this->vertices).m_capacity = 0;
  (this->edges).m_ownsMemory = true;
  (this->edges).m_data = (HalfEdge *)0x0;
  (this->edges).m_size = 0;
  (this->edges).m_capacity = 0;
  (this->facets).m_ownsMemory = true;
  (this->facets).m_data = (cbtPlane *)0x0;
  (this->facets).m_size = 0;
  (this->facets).m_capacity = 0;
  if (0 < vertices_size) {
    pcVar6 = (cbtVector3 *)cbtAlignedAllocInternal((ulong)(uint)vertices_size << 4,0x10);
    lVar7 = (long)(this->vertices).m_size;
    if (0 < lVar7) {
      lVar10 = 0;
      do {
        puVar1 = (undefined8 *)((long)((this->vertices).m_data)->m_floats + lVar10);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)((long)pcVar6->m_floats + lVar10);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
        lVar10 = lVar10 + 0x10;
      } while (lVar7 * 0x10 != lVar10);
    }
    ptr = (this->vertices).m_data;
    if (ptr != (cbtVector3 *)0x0) {
      if ((this->vertices).m_ownsMemory == true) {
        cbtAlignedFreeInternal(ptr);
      }
      (this->vertices).m_data = (cbtVector3 *)0x0;
    }
    (this->vertices).m_ownsMemory = true;
    (this->vertices).m_data = pcVar6;
    (this->vertices).m_capacity = vertices_size;
  }
  (this->vertices).m_size = vertices_size;
  iVar3 = (this->edges).m_size;
  if (((iVar3 <= edges_size) && (iVar3 < edges_size)) && ((this->edges).m_capacity < edges_size)) {
    if (edges_size == 0) {
      pHVar8 = (HalfEdge *)0x0;
    }
    else {
      pHVar8 = (HalfEdge *)cbtAlignedAllocInternal((long)edges_size << 2,0x10);
    }
    lVar7 = (long)(this->edges).m_size;
    if (0 < lVar7) {
      lVar10 = 0;
      do {
        pHVar8[lVar10] = (this->edges).m_data[lVar10];
        lVar10 = lVar10 + 1;
      } while (lVar7 != lVar10);
    }
    ptr_00 = (this->edges).m_data;
    if (ptr_00 != (HalfEdge *)0x0) {
      if ((this->edges).m_ownsMemory == true) {
        cbtAlignedFreeInternal(ptr_00);
      }
      (this->edges).m_data = (HalfEdge *)0x0;
    }
    (this->edges).m_ownsMemory = true;
    (this->edges).m_data = pHVar8;
    (this->edges).m_capacity = edges_size;
  }
  (this->edges).m_size = edges_size;
  iVar3 = (this->facets).m_size;
  if (iVar3 <= facets_size) {
    if ((iVar3 < facets_size) && ((this->facets).m_capacity < facets_size)) {
      if (facets_size == 0) {
        pcVar9 = (cbtPlane *)0x0;
      }
      else {
        pcVar9 = (cbtPlane *)cbtAlignedAllocInternal((long)facets_size * 0x14,0x10);
      }
      lVar7 = (long)(this->facets).m_size;
      if (0 < lVar7) {
        lVar10 = 0;
        do {
          pcVar4 = (this->facets).m_data;
          *(undefined4 *)((long)(&pcVar9->normal + 1) + lVar10) =
               *(undefined4 *)((long)(&pcVar4->normal + 1) + lVar10);
          puVar1 = (undefined8 *)((long)(pcVar4->normal).m_floats + lVar10);
          uVar5 = puVar1[1];
          puVar2 = (undefined8 *)((long)(pcVar9->normal).m_floats + lVar10);
          *puVar2 = *puVar1;
          puVar2[1] = uVar5;
          lVar10 = lVar10 + 0x14;
        } while (lVar7 * 0x14 != lVar10);
      }
      pcVar4 = (this->facets).m_data;
      if (pcVar4 != (cbtPlane *)0x0) {
        if ((this->facets).m_ownsMemory == true) {
          cbtAlignedFreeInternal(pcVar4);
        }
        (this->facets).m_data = (cbtPlane *)0x0;
      }
      (this->facets).m_ownsMemory = true;
      (this->facets).m_data = pcVar9;
      (this->facets).m_capacity = facets_size;
    }
    if (iVar3 < facets_size) {
      pcVar11 = &(this->facets).m_data[iVar3].dist;
      lVar7 = (long)facets_size - (long)iVar3;
      do {
        *pcVar11 = 0.0;
        pcVar11 = pcVar11 + 5;
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
    }
  }
  (this->facets).m_size = facets_size;
  return;
}

Assistant:

ConvexH::ConvexH(int vertices_size, int edges_size, int facets_size)
{
	vertices.resize(vertices_size);
	edges.resize(edges_size);
	facets.resize(facets_size);
}